

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Array<char> * __thiscall
kj::Vector<char>::releaseAsArray(Array<char> *__return_storage_ptr__,Vector<char> *this)

{
  bool bVar1;
  size_t newSize;
  Vector<char> *this_local;
  
  bVar1 = ArrayBuilder<char>::isFull(&this->builder);
  if (!bVar1) {
    newSize = size(this);
    setCapacity(this,newSize);
  }
  ArrayBuilder<char>::finish(__return_storage_ptr__,&this->builder);
  return __return_storage_ptr__;
}

Assistant:

inline Array<T> releaseAsArray() {
    // TODO(perf):  Avoid a copy/move by allowing Array<T> to point to incomplete space?
    if (!builder.isFull()) {
      setCapacity(size());
    }
    return builder.finish();
  }